

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bspline.cpp
# Opt level: O2

double __thiscall agg::bspline::interpolation(bspline *this,double x,int i)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar8 = this->m_x[i];
  dVar4 = this->m_x[(long)i + 1];
  dVar7 = dVar8 - dVar4;
  dVar8 = dVar8 - x;
  dVar9 = (dVar7 * dVar7) / 6.0;
  dVar4 = x - dVar4;
  pdVar3 = (this->m_am).m_array;
  dVar1 = pdVar3[i + 1];
  dVar2 = pdVar3[(uint)i];
  auVar5._0_8_ = dVar8 * dVar8 * dVar1 * dVar8 + dVar4 * dVar4 * dVar2 * dVar4;
  auVar5._8_8_ = dVar8 * (this->m_y[(long)i + 1] - dVar1 * dVar9) +
                 dVar4 * (this->m_y[i] - dVar9 * dVar2);
  auVar6._8_8_ = dVar7;
  auVar6._0_8_ = 0x4018000000000000;
  auVar6 = divpd(auVar5,auVar6);
  return auVar6._8_8_ + auVar6._0_8_ / dVar7;
}

Assistant:

double bspline::interpolation(double x, int i) const
    {
        int j = i + 1;
        double d = m_x[i] - m_x[j];
        double h = x - m_x[j];
        double r = m_x[i] - x;
        double p = d * d / 6.0;
        return (m_am[j] * r * r * r + m_am[i] * h * h * h) / 6.0 / d +
               ((m_y[j] - m_am[j] * p) * r + (m_y[i] - m_am[i] * p) * h) / d;
    }